

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int compare_multisig_node(void *source,void *destination)

{
  uint local_34;
  uint32_t index;
  multisig_sort_data_t *dest;
  multisig_sort_data_t *src;
  void *destination_local;
  void *source_local;
  
  local_34 = 0;
  if (*(int *)((long)source + 0x4c) == *(int *)((long)destination + 0x4c)) {
    for (; local_34 < *(uint *)((long)source + 0x4c); local_34 = local_34 + 1) {
      if (*(char *)((long)source + (ulong)local_34 + 8) !=
          *(char *)((long)destination + (ulong)local_34 + 8)) {
        return (uint)*(byte *)((long)source + (ulong)local_34 + 8) -
               (uint)*(byte *)((long)destination + (ulong)local_34 + 8);
      }
    }
    source_local._4_4_ = 0;
  }
  else {
    source_local._4_4_ = (uint)*(byte *)((long)source + 8) - (uint)*(byte *)((long)destination + 8);
  }
  return source_local._4_4_;
}

Assistant:

static int compare_multisig_node(const void *source, const void *destination)
{
    const struct multisig_sort_data_t *src = (const struct multisig_sort_data_t *)source;
    const struct multisig_sort_data_t *dest = (const struct multisig_sort_data_t *)destination;
    uint32_t index = 0;
    if (src->script_size != dest->script_size) {
        /* Head byte of compressed pubkey and uncompressed pubkey are different. */
        return (int)src->script[0] - (int)dest->script[0];
    }

    for (; index < src->script_size; ++index) {
        if (src->script[index] != dest->script[index]) {
            return (int)src->script[index] - (int)dest->script[index];
        }
    }
    return 0;
}